

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

date_time * __thiscall
booster::locale::date_time::operator=(date_time *this,date_time_period_set *s)

{
  period_mark pVar1;
  size_t sVar2;
  abstract_calendar *paVar3;
  date_time_period *pdVar4;
  date_time_period_set *in_RDI;
  size_t in_stack_00000020;
  uint i;
  uint local_14;
  date_time_period_set *this_00;
  
  local_14 = 0;
  this_00 = in_RDI;
  while( true ) {
    sVar2 = date_time_period_set::size(this_00);
    if (sVar2 <= local_14) break;
    paVar3 = hold_ptr<booster::locale::abstract_calendar>::operator->
                       ((hold_ptr<booster::locale::abstract_calendar> *)in_RDI);
    pdVar4 = date_time_period_set::operator[](s,in_stack_00000020);
    pVar1 = period::period_type::mark((period_type *)pdVar4);
    pdVar4 = date_time_period_set::operator[](s,in_stack_00000020);
    (*paVar3->_vptr_abstract_calendar[1])(paVar3,(ulong)pVar1,(ulong)*(uint *)(pdVar4 + 4));
    local_14 = local_14 + 1;
  }
  paVar3 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)in_RDI);
  (*paVar3->_vptr_abstract_calendar[2])();
  return (date_time *)in_RDI;
}

Assistant:

date_time const &date_time::operator=(date_time_period_set const &s)
{
    for(unsigned i=0;i<s.size();i++)
        impl_->set_value(s[i].type.mark(),s[i].value);
    impl_->normalize();
    return *this;
}